

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall
CConnman::Bind(CConnman *this,CService *addr_,uint flags,NetPermissionFlags permissions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CClientUIInterface *this_00;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  bilingual_str strError;
  CService addr;
  string local_c0;
  bilingual_str local_a0;
  direct_or_indirect local_60;
  uint local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeFlipIPv6toCJDNS((CService *)&local_60.indirect_contents,addr_);
  paVar1 = &local_a0.original.field_2;
  local_a0.original._M_string_length = 0;
  local_a0.original.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_a0.translated.field_2;
  local_a0.translated._M_string_length = 0;
  local_a0.translated.field_2._M_local_buf[0] = '\0';
  local_a0.original._M_dataplus._M_p = (pointer)paVar1;
  local_a0.translated._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = BindListenPort(this,(CService *)&local_60.indirect_contents,&local_a0,permissions);
  if (bVar3) {
    bVar4 = CNetAddr::IsRoutable((CNetAddr *)&local_60.indirect_contents);
    if ((((bVar4) && ((~permissions & 0x50) != 0)) && ((flags & 2) == 0)) && (fDiscover != false)) {
      AddLocal((CService *)&local_60.indirect_contents,2);
    }
  }
  else if (((flags & 1) != 0) &&
          (this_00 = this->m_client_interface, this_00 != (CClientUIInterface *)0x0)) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    CClientUIInterface::ThreadSafeMessageBox(this_00,&local_a0,&local_c0,0x10000402);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.translated._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.translated._M_dataplus._M_p,
                    CONCAT71(local_a0.translated.field_2._M_allocated_capacity._1_7_,
                             local_a0.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.original._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.original._M_dataplus._M_p,
                    CONCAT71(local_a0.original.field_2._M_allocated_capacity._1_7_,
                             local_a0.original.field_2._M_local_buf[0]) + 1);
  }
  if (0x10 < local_50) {
    free(local_60.indirect_contents.indirect);
    local_60.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::Bind(const CService& addr_, unsigned int flags, NetPermissionFlags permissions)
{
    const CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    bilingual_str strError;
    if (!BindListenPort(addr, strError, permissions)) {
        if ((flags & BF_REPORT_ERROR) && m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(strError, "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }

    if (addr.IsRoutable() && fDiscover && !(flags & BF_DONT_ADVERTISE) && !NetPermissions::HasFlag(permissions, NetPermissionFlags::NoBan)) {
        AddLocal(addr, LOCAL_BIND);
    }

    return true;
}